

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O2

adios2_error
adios2_add_operation
          (size_t *operation_index,adios2_variable *variable,adios2_operator *op,char *key,
          char *value)

{
  mapped_type *pmVar1;
  _Rb_tree_node_base *p_Var2;
  size_t sVar3;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_132;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_131;
  char *value_local;
  char *key_local;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  Params params;
  
  value_local = value;
  key_local = key;
  std::__cxx11::string::string
            ((string *)&local_80,"for adios2_variable, in call to adios2_add_operation",
             (allocator *)&local_120);
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string
            ((string *)&local_a0,"for adios2_operator, in call to adios2_add_operation",
             (allocator *)&local_120);
  adios2::helper::operator>(op,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string
            ((string *)&local_c0,"for char* key, in call to adios2_add_operation",
             (allocator *)&local_120);
  adios2::helper::CheckForNullptr<char_const>(key,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string
            ((string *)&local_e0,"for char* value, in call to adios2_add_operation",
             (allocator *)&local_120);
  adios2::helper::CheckForNullptr<char_const>(value,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*&,_const_char_*&,_true>(&local_120,&key_local,&value_local);
  __l._M_len = 1;
  __l._M_array = &local_120;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&params,__l,&local_131,&local_132);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_120);
  for (p_Var2 = *(_Rb_tree_node_base **)(op + 0x38); p_Var2 != (_Rb_tree_node_base *)(op + 0x28);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)(p_Var2 + 1));
    std::__cxx11::string::_M_assign((string *)pmVar1);
  }
  sVar3 = adios2::core::VariableBase::AddOperation((string *)variable,(map *)op);
  *operation_index = sVar3;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&params._M_t);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_add_operation(size_t *operation_index, adios2_variable *variable,
                                  adios2_operator *op, const char *key, const char *value)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_add_operation");
        adios2::helper::CheckForNullptr(op, "for adios2_operator, in call to "
                                            "adios2_add_operation");

        adios2::helper::CheckForNullptr(key, "for char* key, in call to "
                                             "adios2_add_operation");

        adios2::helper::CheckForNullptr(value, "for char* value, in call to "
                                               "adios2_add_operation");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);

        auto *opCpp = reinterpret_cast<std::pair<std::string, adios2::Params> *>(op);

        auto params = adios2::Params{{key, value}};

        for (const auto &p : opCpp->second)
        {
            params[p.first] = p.second;
        }

        *operation_index = variableBase->AddOperation(opCpp->first, params);

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_add_operation"));
    }
}